

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

void duckdb::TimeToStringCast::Format
               (char *data,idx_t length,int32_t hour,int32_t minute,int32_t second,
               int32_t microsecond,char *micro_buffer)

{
  char cVar1;
  
  if (hour < 10) {
    *data = '0';
    cVar1 = (char)hour + '0';
  }
  else {
    *data = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)hour * 2];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)(hour * 2) + 1];
  }
  data[1] = cVar1;
  data[2] = ':';
  if (minute < 10) {
    data[3] = '0';
    cVar1 = (char)minute + '0';
  }
  else {
    data[3] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)minute * 2];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)(minute * 2) + 1];
  }
  data[4] = cVar1;
  data[5] = ':';
  if (second < 10) {
    data[6] = '0';
    cVar1 = (char)second + '0';
  }
  else {
    data[6] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)second * 2];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)(second * 2) + 1];
  }
  data[7] = cVar1;
  if (8 < length) {
    data[8] = '.';
    switchD_015de399::default(data + 9,micro_buffer,length - 9);
    return;
  }
  return;
}

Assistant:

static void Format(char *data, idx_t length, int32_t hour, int32_t minute, int32_t second, int32_t microsecond,
	                   char micro_buffer[]) {
		// first write hour, month and day
		FormatTwoDigits(data, hour);
		data[2] = ':';
		FormatTwoDigits(data + 3, minute);
		data[5] = ':';
		FormatTwoDigits(data + 6, second);
		if (length > 8) {
			// write the micro seconds at the end
			data[8] = '.';
			memcpy(data + 9, micro_buffer, length - 9);
		}
	}